

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::transform
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,AffineSpace3fa *space)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  
  pp_Var3 = (_func_int **)alignedMalloc(0x90,0x10);
  p_Var1 = *(_func_int **)&space[2].l.vx.field_0;
  p_Var2 = *(_func_int **)((long)&space[2].l.vx.field_0 + 8);
  pp_Var3[1] = (_func_int *)0x0;
  pp_Var3[2] = (_func_int *)(pp_Var3 + 4);
  pp_Var3[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 4) = 0;
  pp_Var3[6] = (_func_int *)(pp_Var3 + 8);
  pp_Var3[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 8) = 0;
  pp_Var3[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var3 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var3 + 0x5c) = 0xffffffff;
  pp_Var3[0xc] = (_func_int *)0x0;
  *pp_Var3 = (_func_int *)&PTR__Node_002c57f8;
  *(undefined4 *)(pp_Var3 + 0xe) = 0;
  pp_Var3[0x10] = p_Var1;
  pp_Var3[0x11] = p_Var2;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var3;
  LOCK();
  pp_Var3[1] = pp_Var3[1] + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }